

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# painter.cpp
# Opt level: O1

void __thiscall cppurses::Painter::Painter(Painter *this,Widget *widg)

{
  size_t sVar1;
  Widget *pWVar2;
  size_t sVar3;
  size_t sVar4;
  _Map_base<cppurses::Widget_*,_std::pair<cppurses::Widget_*const,_std::unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>_>,_std::allocator<std::pair<cppurses::Widget_*const,_std::unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cppurses::Widget_*>,_std::hash<cppurses::Widget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar5;
  bool bVar6;
  Widget *local_30;
  
  this->widget_ = widg;
  sVar1 = widg->outer_width_;
  sVar3 = detail::Border_offset::east(widg);
  sVar4 = detail::Border_offset::west(widg);
  (this->inner_area_).width = sVar1 - (sVar4 + sVar3);
  pWVar2 = this->widget_;
  sVar1 = pWVar2->outer_height_;
  sVar3 = detail::Border_offset::north(pWVar2);
  sVar4 = detail::Border_offset::south(pWVar2);
  (this->inner_area_).height = sVar1 - (sVar4 + sVar3);
  pWVar2 = this->widget_;
  bVar6 = false;
  if ((pWVar2->enabled_ == true) && (bVar6 = false, pWVar2->outer_width_ != 0)) {
    bVar6 = pWVar2->outer_height_ != 0;
  }
  this->is_paintable_ = bVar6;
  this_00 = (_Map_base<cppurses::Widget_*,_std::pair<cppurses::Widget_*const,_std::unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>_>,_std::allocator<std::pair<cppurses::Widget_*const,_std::unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cppurses::Widget_*>,_std::hash<cppurses::Widget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)detail::Staged_changes::get();
  local_30 = widg;
  pmVar5 = std::__detail::
           _Map_base<cppurses::Widget_*,_std::pair<cppurses::Widget_*const,_std::unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>_>,_std::allocator<std::pair<cppurses::Widget_*const,_std::unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cppurses::Widget_*>,_std::hash<cppurses::Widget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](this_00,&local_30);
  this->staged_changes_ = pmVar5;
  return;
}

Assistant:

Painter::Painter(Widget& widg)
    : widget_{widg},
      inner_area_{widget_.width(), widget_.height()},
      is_paintable_{detail::is_paintable(widget_)},
      staged_changes_{detail::Staged_changes::get()[&widg]}
{}